

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString2(ScriptContext *this,char16 ch1,char16 ch2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (0xffb4 < (ushort)(ch2 + L'ﾅ') && 0xffb4 < (ushort)(ch1 + L'ﾅ')) {
    if (0x4a < (ushort)(ch1 + L'￐')) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptLibrary.h"
                                  ,0x3d,"(ch >= \'0\' && ch <= \'z\')","ch >= \'0\' && ch <= \'z\'")
      ;
      if (!bVar2) goto LAB_0079085c;
      *puVar3 = 0;
    }
    if ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings
        [(ushort)ch1 - 0x30].ptr != (PropertyStringMap *)0x0) {
      if (0x4a < (ushort)(ch2 + L'￐')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptLibrary.h"
                                    ,0x3d,"(ch >= \'0\' && ch <= \'z\')",
                                    "ch >= \'0\' && ch <= \'z\'");
        if (!bVar2) {
LAB_0079085c:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      return ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings
              [(ushort)ch1 - 0x30].ptr)->strLen2[(ushort)ch2 - 0x30].ptr;
    }
  }
  return (PropertyString *)0x0;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString2(char16 ch1, char16 ch2)
    {
        if (ch1 < '0' || ch1 > 'z' || ch2 < '0' || ch2 > 'z')
        {
            return NULL;
        }
        const uint i = PropertyStringMap::PStrMapIndex(ch1);
        if (this->Cache()->propertyStrings[i] == NULL)
        {
            return NULL;
        }
        const uint j = PropertyStringMap::PStrMapIndex(ch2);
        return this->Cache()->propertyStrings[i]->strLen2[j];
    }